

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall gl4cts::GLSL420Pack::APITestBase::testCompute(APITestBase *this)

{
  byte bVar1;
  int iVar2;
  MessageBuilder message;
  shaderCompilationException *exc;
  programLinkageException *exc_1;
  shaderSource local_f0;
  shaderSource local_d0;
  shaderSource local_b0;
  shaderSource local_90;
  undefined4 local_70;
  undefined1 local_60 [8];
  shaderSource compute_shader;
  program program;
  APITestBase *this_local;
  
  Utils::program::program
            ((program *)&compute_shader.m_use_lengths,
             (this->super_TestBase).super_TestCase.m_context);
  Utils::shaderSource::shaderSource((shaderSource *)local_60);
  TestBase::initShaderSource(&this->super_TestBase,COMPUTE_SHADER,false,(shaderSource *)local_60);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                *)local_60,0);
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 1) {
    this_local._7_1_ = true;
  }
  else {
    Utils::shaderSource::shaderSource(&local_90,(GLchar *)0x0);
    Utils::shaderSource::shaderSource(&local_b0,(GLchar *)0x0);
    Utils::shaderSource::shaderSource(&local_d0,(GLchar *)0x0);
    Utils::shaderSource::shaderSource(&local_f0,(GLchar *)0x0);
    Utils::shaderSource::shaderSource((shaderSource *)&exc_1,(GLchar *)0x0);
    Utils::program::build
              ((program *)&compute_shader.m_use_lengths,(shaderSource *)local_60,&local_90,&local_b0
               ,&local_d0,&local_f0,(shaderSource *)&exc_1,(GLchar **)0x0,0,false);
    Utils::shaderSource::~shaderSource((shaderSource *)&exc_1);
    Utils::shaderSource::~shaderSource(&local_f0);
    Utils::shaderSource::~shaderSource(&local_d0);
    Utils::shaderSource::~shaderSource(&local_b0);
    Utils::shaderSource::~shaderSource(&local_90);
    Utils::program::use((program *)&compute_shader.m_use_lengths);
    iVar2 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
              [0xc])(this,&compute_shader.m_use_lengths);
    this_local._7_1_ = (bool)((byte)iVar2 & 1);
  }
  local_70 = 1;
  Utils::shaderSource::~shaderSource((shaderSource *)local_60);
  Utils::program::~program((program *)&compute_shader.m_use_lengths);
  return this_local._7_1_;
}

Assistant:

bool APITestBase::testCompute()
{
	/* GL objects */
	Utils::program program(m_context);

	/* Shaders */
	Utils::shaderSource compute_shader;
	initShaderSource(Utils::COMPUTE_SHADER, false, compute_shader);

	/* Check if test support compute shaders */
	if (true == compute_shader.m_parts[0].m_code.empty())
	{
		return true;
	}

	/* Build program */
	try
	{
		program.build(compute_shader, 0 /* fragment shader */, 0 /* geometry shader */,
					  0 /* tesselation control shader */, 0 /* tesselation evaluation shader */, 0 /* vertex shader */,
					  0 /* varying names */, 0 /* n varying names */, false);
	}
	catch (Utils::shaderCompilationException& exc)
	{
		/* Something wrong with compilation, test case failed */
		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Shader compilation failed. Error message: " << exc.m_error_message;

		Utils::program::printShaderSource(exc.m_shader_source, message);

		message << tcu::TestLog::EndMessage;

		return false;
	}
	catch (Utils::programLinkageException& exc)
	{
		/* Something wrong with linking, test case failed */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Program linking failed. Error message: " << exc.m_error_message
											<< tcu::TestLog::EndMessage;
		return false;
	}

	/* Set current program */
	program.use();

	/* Return result of verification */
	return checkResults(program);
}